

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

btScalar gjkepa2_impl::GJK::projectorigin(btVector3 *a,btVector3 *b,btVector3 *c,btScalar *w,U *m)

{
  uint uVar1;
  btVector3 *a_00;
  U *pUVar2;
  btVector3 *this;
  U i;
  long lVar3;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  U subm;
  btScalar subw [2];
  btVector3 n;
  btVector3 *vt [3];
  btVector3 local_98;
  btVector3 local_88;
  btVector3 dl [3];
  btVector3 p;
  
  vt[0] = a;
  vt[1] = b;
  vt[2] = c;
  dl[0] = operator-(a,b);
  dl[1] = operator-(b,c);
  dl[2] = operator-(c,a);
  this = dl;
  n = btVector3::cross(this,dl + 1);
  bVar4 = btVector3::length2(&n);
  if (bVar4 <= 0.0) {
    fVar6 = -1.0;
  }
  else {
    subw[0] = 0.0;
    subw[1] = 0.0;
    subm = 0;
    fVar6 = -1.0;
    pUVar2 = projectorigin::imd3;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      a_00 = vt[lVar3];
      bVar10 = btVector3::cross(this,&n);
      if (0.0 < bVar10.m_floats[2] * a_00->m_floats[2] +
                a_00->m_floats[0] * bVar10.m_floats[0] + bVar10.m_floats[1] * a_00->m_floats[1]) {
        uVar1 = *pUVar2;
        bVar5 = projectorigin(a_00,vt[uVar1],subw,&subm);
        if ((fVar6 < 0.0) || (bVar5 < fVar6)) {
          *m = (1 << ((byte)uVar1 & 0x1f) & (int)(subm << 0x1e) >> 0x1f) +
               (1 << ((byte)lVar3 & 0x1f) & -(subm & 1));
          w[lVar3] = subw[0];
          w[uVar1] = subw[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          fVar6 = bVar5;
        }
      }
      this = this + 1;
      pUVar2 = pUVar2 + 1;
    }
    if (fVar6 < 0.0) {
      fVar8 = a->m_floats[1] * n.m_floats[1];
      fVar6 = a->m_floats[0] * n.m_floats[0];
      fVar9 = a->m_floats[2] * n.m_floats[2];
      if (bVar4 < 0.0) {
        fVar7 = sqrtf(bVar4);
      }
      else {
        fVar7 = SQRT(bVar4);
      }
      fVar6 = (fVar9 + fVar6 + fVar8) / bVar4;
      p.m_floats[1] = fVar6 * n.m_floats[1];
      p.m_floats[0] = fVar6 * n.m_floats[0];
      p.m_floats[2] = fVar6 * n.m_floats[2];
      p.m_floats[3] = 0.0;
      fVar6 = btVector3::length2(&p);
      *m = 7;
      local_98 = operator-(b,&p);
      local_88 = btVector3::cross(dl + 1,&local_98);
      bVar4 = btVector3::length(&local_88);
      *w = bVar4 / fVar7;
      local_98 = operator-(c,&p);
      local_88 = btVector3::cross(dl + 2,&local_98);
      bVar4 = btVector3::length(&local_88);
      w[1] = bVar4 / fVar7;
      w[2] = 1.0 - (bVar4 / fVar7 + *w);
    }
  }
  return fVar6;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c};
				const btVector3		dl[]={a-b,b-c,c-a};
				const btVector3		n=btCross(dl[0],dl[1]);
				const btScalar		l=n.length2();
				if(l>GJK_SIMPLEX3_EPS)
				{
					btScalar	mindist=-1;
					btScalar	subw[2]={0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						if(btDot(*vt[i],btCross(dl[i],n))>0)
						{
							const U			j=imd3[i];
							const btScalar	subd(projectorigin(*vt[i],*vt[j],subw,subm));
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>(((subm&1)?1<<i:0)+((subm&2)?1<<j:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;				
							}
						}
					}
					if(mindist<0)
					{
						const btScalar	d=btDot(a,n);	
						const btScalar	s=btSqrt(l);
						const btVector3	p=n*(d/l);
						mindist	=	p.length2();
						m		=	7;
						w[0]	=	(btCross(dl[1],b-p)).length()/s;
						w[1]	=	(btCross(dl[2],c-p)).length()/s;
						w[2]	=	1-(w[0]+w[1]);
					}
					return(mindist);
				}
				return(-1);
			}